

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLLoader.cpp
# Opt level: O1

int Load_ARB_geometry_shader4(void)

{
  uint uVar1;
  bool bVar2;
  
  sf_ptrc_glFramebufferTextureARB =
       (_func_void_GLenum_GLenum_GLuint_GLint *)sf::Context::getFunction("glFramebufferTextureARB");
  bVar2 = sf_ptrc_glFramebufferTextureARB == (_func_void_GLenum_GLenum_GLuint_GLint *)0x0;
  sf_ptrc_glFramebufferTextureFaceARB =
       (_func_void_GLenum_GLenum_GLuint_GLint_GLenum *)
       sf::Context::getFunction("glFramebufferTextureFaceARB");
  uVar1 = bVar2 + 1;
  if (sf_ptrc_glFramebufferTextureFaceARB != (_func_void_GLenum_GLenum_GLuint_GLint_GLenum *)0x0) {
    uVar1 = (uint)bVar2;
  }
  sf_ptrc_glFramebufferTextureLayerARB =
       (_func_void_GLenum_GLenum_GLuint_GLint_GLint *)
       sf::Context::getFunction("glFramebufferTextureLayerARB");
  bVar2 = sf_ptrc_glFramebufferTextureLayerARB == (_func_void_GLenum_GLenum_GLuint_GLint_GLint *)0x0
  ;
  sf_ptrc_glProgramParameteriARB =
       (_func_void_GLuint_GLenum_GLint *)sf::Context::getFunction("glProgramParameteriARB");
  return bVar2 + uVar1 +
         (uint)(sf_ptrc_glProgramParameteriARB == (_func_void_GLuint_GLenum_GLint *)0x0);
}

Assistant:

static sf::GlFunctionPointer glLoaderGetProcAddress(const char* name)
{
    return sf::Context::getFunction(name);
}